

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O1

bool_t priIsSGPrime(word *q,size_t n,void *stack)

{
  undefined8 *puVar1;
  int iVar2;
  size_t sVar3;
  void *stack_00;
  qr_o *r;
  
  puVar1 = (undefined8 *)((long)stack + n * 8);
  r = (qr_o *)(puVar1 + 1);
  sVar3 = zmCreate_keep(n * 8 + 8);
  stack_00 = (void *)((long)stack + sVar3 + n * 8 + 8);
  wwCopy((word *)stack,q,n);
  *puVar1 = 0;
  wwShHi((word *)stack,n + 1,1);
  *(long *)stack = *stack + 1;
  sVar3 = wwOctetSize((word *)stack,n + 1);
  u64To(stack,sVar3,(u64 *)stack);
  zmCreate(r,(octet *)stack,sVar3,stack_00);
  (*(code *)puVar1[0xb])(stack,puVar1[5],puVar1[5],r);
  (*(code *)puVar1[0xb])(stack,stack,stack,r);
  qrPower((word *)stack,(word *)stack,q,n,r,stack_00);
  iVar2 = wwCmp((word *)stack,(word *)puVar1[5],puVar1[7]);
  return (bool_t)(iVar2 == 0);
}

Assistant:

bool_t priIsSGPrime(const word q[], size_t n, void* stack)
{
	size_t no = O_OF_W(n + 1);
	// переменные в stack
	word* p;
	qr_o* qr;
	// pre
	ASSERT(zzIsOdd(q, n) && wwCmpW(q, n, 1) > 0);
	// раскладка стек
	p = (word*)stack;
	qr = (qr_o*)(p + n + 1);
	stack = (octet*)qr + zmCreate_keep(no);
	// p <- 2q + 1
	wwCopy(p, q, n);
	p[n] = 0;
	wwShHi(p, n + 1, 1);
	++p[0];
	// создать кольцо \mod p
	no = wwOctetSize(p, n + 1);
	wwTo(p, no, p);
	zmCreate(qr, (octet*)p, no, stack);
	// p <- 4^q (в кольце qr)
	qrAdd(p, qr->unity, qr->unity, qr);
	qrAdd(p, p, p, qr);
	qrPower(p, p, q, n, qr, stack);
	// 4^q == 1 (в кольце qr)?
	return qrCmp(p, qr->unity, qr) == 0;
}